

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.hpp
# Opt level: O2

void __thiscall duckdb::LambdaFunctions::ColumnInfo::~ColumnInfo(ColumnInfo *this)

{
  UnifiedVectorFormat::~UnifiedVectorFormat(&this->format);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->sel).selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

explicit ColumnInfo(Vector &vector) : vector(vector), sel(SelectionVector(STANDARD_VECTOR_SIZE)) {}